

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::PartitionGraph::forceMove(PartitionGraph *this,size_t v,size_t partitionId)

{
  pointer puVar1;
  ostream *poVar2;
  runtime_error *this_00;
  __node_gen_type __node_gen;
  size_t local_28;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_20;
  
  puVar1 = (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_28 = v;
  if (v < (ulong)((long)(this->vertexLabels_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->partitions_).
                super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[puVar1[v]]._M_h,&local_28);
    local_20 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)((this->partitions_).
                   super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + partitionId);
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              (local_20,&local_28);
    (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[local_28] = partitionId;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error log: Node v=",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Failed to forceMove. Node doesnt exist!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void forceMove(const size_t v, const size_t partitionId)
    {
        if (v >= vertexLabels_.size()) {
            std::cerr << "Error log: Node v=" << v << std::endl;
            throw std::runtime_error("Failed to forceMove. Node doesnt exist!");
        }
        const size_t previousPartition = vertexLabels_[v];

        // move the node v to the same partition w.
        partitions_[previousPartition].erase(v);
        partitions_[partitionId].insert(v);
        vertexLabels_[v] = partitionId;
    }